

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::TestRegistry::getMatchingTestCases
          (TestRegistry *this,string *rawTestSpec,
          vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_> *matchingTestsOut)

{
  TestCaseInfo *pTVar1;
  bool bVar2;
  TestCaseInfo *testCase;
  TestCaseFilter filter;
  TestCaseFilter local_48;
  
  TestCaseFilter::TestCaseFilter(&local_48,rawTestSpec,AutoDetectBehaviour);
  pTVar1 = (this->m_functionsInOrder).
           super__Vector_base<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (testCase = (this->m_functionsInOrder).
                  super__Vector_base<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start; testCase != pTVar1;
      testCase = testCase + 1) {
    bVar2 = TestCaseFilter::isMatch(&local_48,testCase);
    if (bVar2 != (local_48.m_filterType != IncludeTests)) {
      std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>::push_back
                (matchingTestsOut,testCase);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_stringToMatch._M_dataplus._M_p != &local_48.m_stringToMatch.field_2) {
    operator_delete(local_48.m_stringToMatch._M_dataplus._M_p,
                    local_48.m_stringToMatch.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void getMatchingTestCases( const std::string& rawTestSpec, std::vector<TestCaseInfo>& matchingTestsOut ) const {
            TestCaseFilter filter( rawTestSpec );

            std::vector<TestCaseInfo>::const_iterator it = m_functionsInOrder.begin();
            std::vector<TestCaseInfo>::const_iterator itEnd = m_functionsInOrder.end();
            for(; it != itEnd; ++it ) {
                if( filter.shouldInclude( *it ) ) {
                    matchingTestsOut.push_back( *it );
                }
            }
        }